

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS
extract_displaced_xyz(REF_NODE ref_node,REF_INT *ldim,REF_DBL **initial_field,REF_DBL **displaced)

{
  REF_DBL *pRVar1;
  int local_38;
  int local_34;
  REF_INT node;
  REF_INT i;
  REF_DBL **displaced_local;
  REF_DBL **initial_field_local;
  REF_INT *ldim_local;
  REF_NODE ref_node_local;
  
  if (ref_node->max * 3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xb0d,"extract_displaced_xyz","malloc *displaced of REF_DBL negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    pRVar1 = (REF_DBL *)malloc((long)(ref_node->max * 3) << 3);
    *displaced = pRVar1;
    if (*displaced == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xb0d,"extract_displaced_xyz","malloc *displaced of REF_DBL NULL");
      ref_node_local._4_4_ = 2;
    }
    else {
      for (local_38 = 0; local_38 < ref_node->max; local_38 = local_38 + 1) {
        if (((-1 < local_38) && (local_38 < ref_node->max)) && (-1 < ref_node->global[local_38])) {
          for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
            (*displaced)[local_34 + local_38 * 3] = (*initial_field)[local_34 + *ldim * local_38];
          }
        }
      }
      *ldim = *ldim + -3;
      for (local_38 = 0; local_38 < ref_node->max; local_38 = local_38 + 1) {
        if (((-1 < local_38) && (local_38 < ref_node->max)) && (-1 < ref_node->global[local_38])) {
          for (local_34 = 0; local_34 < *ldim; local_34 = local_34 + 1) {
            (*initial_field)[local_34 + *ldim * local_38] =
                 (*initial_field)[local_34 + 3 + (*ldim + 3) * local_38];
          }
        }
      }
      fflush(_stdout);
      if (0 < *ldim * ref_node->max) {
        pRVar1 = (REF_DBL *)realloc(*initial_field,(long)(*ldim * ref_node->max) << 3);
        *initial_field = pRVar1;
      }
      if (*initial_field == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0xb1a,"extract_displaced_xyz","realloc *initial_field NULL");
        printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
               (ulong)(uint)(*ldim * ref_node->max),(long)(*ldim * ref_node->max),8,
               (long)(*ldim * ref_node->max) << 3);
        ref_node_local._4_4_ = 2;
      }
      else {
        ref_node_local._4_4_ = 0;
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

static REF_STATUS extract_displaced_xyz(REF_NODE ref_node, REF_INT *ldim,
                                        REF_DBL **initial_field,
                                        REF_DBL **displaced) {
  REF_INT i, node;

  ref_malloc(*displaced, 3 * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 3; i++) {
      (*displaced)[i + 3 * node] = (*initial_field)[i + (*ldim) * node];
    }
  }
  (*ldim) -= 3;
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < (*ldim); i++) {
      (*initial_field)[i + (*ldim) * node] =
          (*initial_field)[i + 3 + ((*ldim) + 3) * node];
    }
  }
  ref_realloc(*initial_field, (*ldim) * ref_node_max(ref_node), REF_DBL);
  return REF_SUCCESS;
}